

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SourceArrayLoader14::begin__param
          (SourceArrayLoader14 *this,param__AttributeData *attributeData)

{
  byte bVar1;
  undefined8 *in_RSI;
  long in_RDI;
  param__AttributeData attrData;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_30 = *in_RSI;
  local_28 = in_RSI[1];
  local_20 = in_RSI[2];
  local_18 = in_RSI[3];
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x18) + 0xa8))(*(long **)(in_RDI + 0x18),&local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SourceArrayLoader14::begin__param( const COLLADASaxFWL14::param__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__param(attributeData));
COLLADASaxFWL::param__AttributeData attrData;
attrData.name = attributeData.name;
attrData.sid = attributeData.sid;
attrData.semantic = attributeData.semantic;
attrData.type = attributeData.type;
return mLoader->begin__param(attrData);
}